

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_write.c
# Opt level: O3

void write_crt(ubyte iobyte)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar5;
  uint uVar6;
  ulong uVar4;
  
  uVar3 = (uint)crt_sel;
  uVar4 = (ulong)uVar3;
  if (uVar4 < 0x10) {
    crt_regs[uVar4] = iobyte;
  }
  if (uVar4 != 0xf) {
    if (uVar3 == 0xd) {
      if (teletext == '\0') {
        screen_start = (ushort)crt_regs[0xc] * 0x800 + (ushort)crt_regs[0xd] * 8;
      }
      else {
        screen_start = (CONCAT11(crt_regs[0xc],crt_regs[0xd]) ^ 0x2000) + 0x7400;
      }
      (*update_screen)();
      return;
    }
    if (uVar3 != 1) {
      return;
    }
    set_colour_bits();
    return;
  }
  if (teletext != '\0') {
    uVar2 = CONCAT11(crt_regs[0xe],crt_regs[0xf]) ^ 0x2000;
    uVar1 = uVar2 + 0x7400;
    uVar2 = uVar2 + 0x7800;
    if (screen_start <= uVar1) {
      uVar2 = uVar1;
    }
    gotoxy((ushort)(uVar2 - screen_start) % 0x28 + 1,(ushort)(uVar2 - screen_start) / 0x28 + 1);
    return;
  }
  switch(vid_con_reg >> 5 & 3) {
  case 0:
    uVar5 = 1;
    break;
  case 1:
    puts("Invalid Cursor");
    exit(1);
  case 2:
    uVar5 = 2;
    break;
  case 3:
    uVar5 = 4;
  }
  uVar6 = ((short)((ushort)crt_regs[0xe] * 0x800) >> 0xf & (ram_screen_start ^ 0x8000)) +
          (ushort)crt_regs[0xe] * 0x800 + (ushort)crt_regs[0xf] * 8;
  if (update_cursor::old_cursor_wid != 1) {
    if (update_cursor::old_cursor_wid != 2) {
      if (update_cursor::old_cursor_wid != 4) goto LAB_0010c13a;
      (*screen_byte_P)(RAM[(ulong)update_cursor::old_cursor_add + 0x1f],
                       update_cursor::old_cursor_add + 0x1f);
      (*screen_byte_P)(RAM[(ulong)update_cursor::old_cursor_add + 0x17],
                       update_cursor::old_cursor_add + 0x17);
    }
    (*screen_byte_P)(RAM[(ulong)update_cursor::old_cursor_add + 0xf],
                     update_cursor::old_cursor_add + 0xf);
  }
  (*screen_byte_P)(RAM[(ulong)update_cursor::old_cursor_add + 7],update_cursor::old_cursor_add + 7);
LAB_0010c13a:
  if (uVar5 != 1) {
    if (uVar5 != 2) {
      if (uVar5 != 4) {
        update_cursor::old_cursor_add = uVar6;
        update_cursor::old_cursor_wid = uVar5;
        return;
      }
      (*screen_byte_P)(0xff,uVar6 + 0x1f);
      (*screen_byte_P)(0xff,uVar6 + 0x17);
    }
    (*screen_byte_P)(0xff,uVar6 + 0xf);
  }
  (*screen_byte_P)(0xff,uVar6 + 7);
  update_cursor::old_cursor_wid = uVar5;
  update_cursor::old_cursor_add = uVar6;
  return;
}

Assistant:

void write_crt(ubyte iobyte)   // crt controller write decode function
{
    if (crt_sel <= 15)               // if a valid register for writing to
    {
        crt_regs[crt_sel] = iobyte;   // write to the register
    }

    switch (crt_sel)               // take relevant action depending on
        // register action
    {
        case 1:
            set_colour_bits();

        case 12:
            break;
        case 13:
            if (teletext) {
                screen_start = crt_regs[12] * 0x100 + crt_regs[13];
                screen_start = 0x7400 + (screen_start ^ 0x2000);
                update_screen();
            }
            else {
                screen_start = crt_regs[12] * 0x100 + crt_regs[13];
                screen_start <<= 3;
                update_screen();
            }
            break;
        case 14:
            break;
        case 15:
            update_cursor();
            break; // if the cursor address has changed,
    }                               // update the cursor.

}